

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListMessage.cpp
# Opt level: O0

void __thiscall ListMessage::ListMessage(ListMessage *this,char *directory)

{
  char *directory_local;
  ListMessage *this_local;
  
  ServerOperation::ServerOperation(&this->super_ServerOperation,directory);
  (this->super_ServerOperation)._vptr_ServerOperation = (_func_int **)&PTR_fillMe_0010ad50;
  std::__cxx11::string::string((string *)&this->User);
  std::__cxx11::string::operator=((string *)&(this->super_ServerOperation).statusMessage,"User:");
  return;
}

Assistant:

ListMessage::ListMessage(const char * directory) :ServerOperation(directory) {
    statusMessage = "User:";
}